

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O3

void __thiscall glslang::TPoolAllocator::~TPoolAllocator(TPoolAllocator *this)

{
  tHeader *ptVar1;
  pointer ptVar2;
  tHeader *ptVar3;
  TAllocation *alloc;
  TAllocation *this_00;
  
  ptVar3 = this->inUseList;
  do {
    if (ptVar3 == (tHeader *)0x0) {
      ptVar3 = this->freeList;
      while (ptVar3 != (tHeader *)0x0) {
        ptVar1 = ptVar3->nextPage;
        operator_delete__(ptVar3);
        this->freeList = ptVar1;
        ptVar3 = ptVar1;
      }
      ptVar2 = (this->stack).
               super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ptVar2 == (pointer)0x0) {
        return;
      }
      operator_delete(ptVar2,(long)(this->stack).
                                   super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar2
                     );
      return;
    }
    this_00 = ptVar3->lastAllocation;
    ptVar1 = ptVar3->nextPage;
    if (this_00 == (TAllocation *)0x0) {
LAB_004c24d8:
      operator_delete__(ptVar3);
    }
    else {
      do {
        TAllocation::check(this_00);
        this_00 = this_00->prevAlloc;
      } while (this_00 != (TAllocation *)0x0);
      ptVar3 = this->inUseList;
      if (ptVar3 != (tHeader *)0x0) goto LAB_004c24d8;
    }
    this->inUseList = ptVar1;
    ptVar3 = ptVar1;
  } while( true );
}

Assistant:

TPoolAllocator::~TPoolAllocator()
{
    while (inUseList) {
        tHeader* next = inUseList->nextPage;
        inUseList->~tHeader();
        delete [] reinterpret_cast<char*>(inUseList);
        inUseList = next;
    }

    //
    // Always delete the free list memory - it can't be being
    // (correctly) referenced, whether the pool allocator was
    // global or not.  We should not check the guard blocks
    // here, because we did it already when the block was
    // placed into the free list.
    //
    while (freeList) {
        tHeader* next = freeList->nextPage;
        delete [] reinterpret_cast<char*>(freeList);
        freeList = next;
    }
}